

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall FDecalLib::AddDecal(FDecalLib *this,FDecalBase *decal)

{
  WORD num_00;
  int iVar1;
  uint uVar2;
  char *__s1;
  char *__s2;
  PClass **ppPVar3;
  FDecalBase *pFVar4;
  FDecalBase *spawner;
  uint i;
  int lexx;
  int num;
  FDecalBase **prev;
  FDecalBase *node;
  FDecalBase *decal_local;
  FDecalLib *this_local;
  
  prev = (FDecalBase **)this->Root;
  num_00 = decal->SpawnID;
  decal->SpawnID = 0;
  _lexx = this;
  while (prev != (FDecalBase **)0x0) {
    __s1 = FName::operator_cast_to_char_(&decal->Name);
    __s2 = FName::operator_cast_to_char_((FName *)(prev + 3));
    iVar1 = strcasecmp(__s1,__s2);
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      _lexx = (FDecalLib *)(prev + 1);
      prev = (FDecalBase **)prev[1];
    }
    else {
      _lexx = (FDecalLib *)(prev + 2);
      prev = (FDecalBase **)prev[2];
    }
  }
  if (prev == (FDecalBase **)0x0) {
    decal->SpawnID = 0;
    _lexx->Root = decal;
    decal->Left = (FDecalBase *)0x0;
    decal->Right = (FDecalBase *)0x0;
  }
  else {
    ReplaceDecalRef((FDecalBase *)prev,decal,this->Root);
    decal->Left = prev[1];
    decal->Right = prev[2];
    _lexx->Root = decal;
    for (spawner._4_4_ = 0;
        uVar2 = TArray<const_PClass_*,_const_PClass_*>::Size
                          ((TArray<const_PClass_*,_const_PClass_*> *)(prev + 4)),
        spawner._4_4_ < uVar2; spawner._4_4_ = spawner._4_4_ + 1) {
      ppPVar3 = TArray<const_PClass_*,_const_PClass_*>::operator[]
                          ((TArray<const_PClass_*,_const_PClass_*> *)(prev + 4),(ulong)spawner._4_4_
                          );
      *(FDecalBase **)((*ppPVar3)->Defaults + 0x478) = decal;
    }
    TArray<const_PClass_*,_const_PClass_*>::operator=
              (&decal->Users,(TArray<const_PClass_*,_const_PClass_*> *)(prev + 4));
    if (prev != (FDecalBase **)0x0) {
      (**(code **)&(*prev)->Name)();
    }
  }
  if (num_00 != 0) {
    pFVar4 = ScanTreeForNum(num_00,this->Root);
    if (pFVar4 != (FDecalBase *)0x0) {
      pFVar4->SpawnID = 0;
    }
    decal->SpawnID = num_00;
  }
  return;
}

Assistant:

void FDecalLib::AddDecal (FDecalBase *decal)
{
	FDecalBase *node = Root, **prev = &Root;
	int num = decal->SpawnID;

	decal->SpawnID = 0;

	// Check if this decal already exists.
	while (node != NULL)
	{
		int lexx = stricmp (decal->Name, node->Name);
		if (lexx == 0)
		{
			break;
		}
		else if (lexx < 0)
		{
			prev = &node->Left;
			node = node->Left;
		}
		else
		{
			prev = &node->Right;
			node = node->Right;
		}
	}
	if (node == NULL)
	{ // No, add it.
		decal->SpawnID = 0;
		*prev = decal;
		decal->Left = NULL;
		decal->Right = NULL;
	}
	else
	{ // Yes, replace the old one.
		// If this decal has been used as the lowerdecal for another decal,
		// be sure and update the lowerdecal to use the new decal.
		ReplaceDecalRef(node, decal, Root);

		decal->Left = node->Left;
		decal->Right = node->Right;
		*prev = decal;

		// Fix references to the old decal so that they use the new one instead.
		for (unsigned int i = 0; i < node->Users.Size(); ++i)
		{
			((AActor *)node->Users[i]->Defaults)->DecalGenerator = decal;
		}
		decal->Users = node->Users;
		delete node;
	}
	// If this decal has an ID, make sure no existing decals have the same ID.
	if (num != 0)
	{
		FDecalBase *spawner = ScanTreeForNum (num, Root);
		if (spawner != NULL)
		{
			spawner->SpawnID = 0;
		}
		decal->SpawnID = num;
	}
}